

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O1

void __thiscall QtMWidgets::DateTimePicker::setDateRange(DateTimePicker *this,QDate *min,QDate *max)

{
  QDate QVar1;
  QTime QVar2;
  QDateTime aQStack_28 [8];
  QDateTime local_20 [8];
  
  QVar1 = (QDate)min->jd;
  if ((QVar1.jd + 0xb69eeff91fU < 0x16d3e147974) && (max->jd + 0xb69eeff91fU < 0x16d3e147974)) {
    QVar2.mds = QDateTime::time();
    QDateTime::QDateTime(local_20,QVar1,QVar2,((this->d).d)->spec,0);
    QVar1 = (QDate)max->jd;
    QVar2.mds = QDateTime::time();
    QDateTime::QDateTime(aQStack_28,QVar1,QVar2,((this->d).d)->spec,0);
    setDateTimeRange(this,local_20,aQStack_28);
    QDateTime::~QDateTime(aQStack_28);
    QDateTime::~QDateTime(local_20);
  }
  return;
}

Assistant:

void
DateTimePicker::setDateRange( const QDate & min, const QDate & max )
{
	if( min.isValid() && max.isValid() )
		setDateTimeRange( QDateTime( min, d->minimum.time(), d->spec ),
			QDateTime( max, d->maximum.time(), d->spec ) );
}